

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O1

void __thiscall FParser::PointlessBrackets(FParser *this,int *start,int *stop)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  lVar3 = (long)*start;
  if (*this->Tokens[lVar3] == '(') {
    while (iVar1 = *stop, *this->Tokens[iVar1] == ')') {
      iVar2 = (int)lVar3;
      if (iVar2 < iVar1) {
        lVar3 = 0;
        iVar4 = 0;
        do {
          if ((this->TokenType[iVar2 + lVar3] == operator_) &&
             (iVar4 = (iVar4 + (uint)(*this->Tokens[iVar2 + lVar3] == '(')) -
                      (uint)(*this->Tokens[iVar2 + lVar3] == ')'), iVar4 == 0)) {
            return;
          }
          lVar3 = lVar3 + 1;
        } while (iVar1 - iVar2 != (int)lVar3);
      }
      *start = iVar2 + 1;
      *stop = *stop + -1;
      lVar3 = (long)*start;
      if (*this->Tokens[lVar3] != '(') {
        return;
      }
    }
  }
  return;
}

Assistant:

void FParser::PointlessBrackets(int *start, int *stop)
{
	int bracket_level, i;
	
	// check that the start and end are brackets
	
	while(Tokens[*start][0] == '(' && Tokens[*stop][0] == ')')
    {
		
		bracket_level = 0;
		
		// confirm there are pointless brackets..
		// if they are, bracket_level will only get to 0
		// at the last token
		// check up to <*stop rather than <=*stop to ignore
		// the last token
		
		for(i = *start; i<*stop; i++)
		{
			if(TokenType[i] != operator_) continue; // ops only
			bracket_level += (Tokens[i][0] == '(');
			bracket_level -= (Tokens[i][0] == ')');
			if(bracket_level == 0) return; // stop if braces stop before end
		}
		
		// move both brackets in
		
		*start = *start + 1;
		*stop = *stop - 1;
    }
}